

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_estimateCompressedSize(HUF_CElt *CTable,uint *count,uint maxSymbolValue)

{
  size_t sVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int s;
  size_t nbBits;
  HUF_CElt *ct;
  undefined4 local_2c;
  undefined8 local_28;
  
  local_28 = 0;
  for (local_2c = 0; local_2c <= in_EDX; local_2c = local_2c + 1) {
    sVar1 = HUF_getNbBits(*(HUF_CElt *)(in_RDI + 8 + (long)local_2c * 8));
    local_28 = sVar1 * *(uint *)(in_RSI + (long)local_2c * 4) + local_28;
  }
  return local_28 >> 3;
}

Assistant:

size_t HUF_estimateCompressedSize(const HUF_CElt* CTable, const unsigned* count, unsigned maxSymbolValue)
{
    HUF_CElt const* ct = CTable + 1;
    size_t nbBits = 0;
    int s;
    for (s = 0; s <= (int)maxSymbolValue; ++s) {
        nbBits += HUF_getNbBits(ct[s]) * count[s];
    }
    return nbBits >> 3;
}